

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O2

int lws_service_adjust_timeout(lws_context *context,int timeout_ms,int tsi)

{
  lws_tls_ops *plVar1;
  _func_int_lws_context_per_thread_ptr *p_Var2;
  int iVar3;
  lws_usec_t lVar4;
  lws_context_per_thread *plVar5;
  
  if (context == (lws_context *)0x0) {
    return 1;
  }
  if (((context->field_0x7b7 & 0x40) == 0) && (iVar3 = lws_protocol_init(context), iVar3 != 0)) {
    return 1;
  }
  if ((tsi == 0) && (iVar3 = lws_smd_message_pending(context), iVar3 != 0)) {
    lws_smd_msg_distribute(context);
    iVar3 = lws_smd_message_pending(context);
    if (iVar3 != 0) {
      return 0;
    }
  }
  plVar5 = context->pt + tsi;
  if (*(long *)((long)context->lcg + (long)tsi * 0x1a0 + -0x70) != 0) {
    lVar4 = lws_now_usecs();
    lVar4 = __lws_sul_service_ripe(context->pt[tsi].pt_sul_owner,2,lVar4);
    if (SBORROW8(lVar4,(long)timeout_ms * 1000) != lVar4 + (long)timeout_ms * -1000 < 0) {
      timeout_ms = (int)(lVar4 / 1000);
    }
  }
  plVar1 = (context->pt[tsi].context)->tls_ops;
  if (((plVar1 == (lws_tls_ops *)0x0) ||
      (p_Var2 = plVar1->fake_POLLIN_for_buffered,
      p_Var2 == (_func_int_lws_context_per_thread_ptr *)0x0)) ||
     (iVar3 = (*p_Var2)(plVar5), iVar3 == 0)) {
    do {
      plVar5 = (lws_context_per_thread *)(plVar5->dll_buflist_owner).head;
      if (plVar5 == (lws_context_per_thread *)0x0) {
        return timeout_ms;
      }
    } while ((*(char *)&plVar5[1].sul_tls.list.next != '\0') ||
            (*(short *)((long)&(((lws_sorted_usec_list_t *)(plVar5[1].pt_sul_owner + 2))->list).prev
                       + 4) == 0x110));
  }
  return 0;
}

Assistant:

int
lws_service_adjust_timeout(struct lws_context *context, int timeout_ms, int tsi)
{
	struct lws_context_per_thread *pt;

	if (!context)
		return 1;

        if (!context->protocol_init_done)
                if (lws_protocol_init(context))
                        return 1;

#if defined(LWS_WITH_SYS_SMD)
	if (!tsi && lws_smd_message_pending(context)) {
		lws_smd_msg_distribute(context);
		if (lws_smd_message_pending(context))
			return 0;
	}
#endif

	pt = &context->pt[tsi];

	if (pt->evlib_pt) {
		lws_usec_t u;

		lws_pt_lock(pt, __func__); /* -------------- pt { */

		u = __lws_sul_service_ripe(pt->pt_sul_owner,
				      LWS_COUNT_PT_SUL_OWNERS, lws_now_usecs());
		if (u < (lws_usec_t)timeout_ms * (lws_usec_t)1000)
			timeout_ms = (int)(u / 1000);

		lws_pt_unlock(pt);
	}

	/*
	 * Figure out if we really want to wait in poll()... we only need to
	 * wait if really nothing already to do and we have to wait for
	 * something from network
	 */
#if defined(LWS_ROLE_WS) && !defined(LWS_WITHOUT_EXTENSIONS)
	/* 1) if we know we are draining rx ext, do not wait in poll */
	if (pt->ws.rx_draining_ext_list)
		return 0;
#endif

#if defined(LWS_WITH_TLS)
	/* 2) if we know we have non-network pending data,
	 *    do not wait in poll */

	if (pt->context->tls_ops &&
	    pt->context->tls_ops->fake_POLLIN_for_buffered &&
	    pt->context->tls_ops->fake_POLLIN_for_buffered(pt))
			return 0;
#endif

	/*
	 * 4) If there is any wsi with rxflow buffered and in a state to process
	 *    it, we should not wait in poll
	 */

	lws_start_foreach_dll(struct lws_dll2 *, d, pt->dll_buflist_owner.head) {
		struct lws *wsi = lws_container_of(d, struct lws, dll_buflist);

		if (!lws_is_flowcontrolled(wsi) &&
		     lwsi_state(wsi) != LRS_DEFERRING_ACTION)
			return 0;

	/*
	 * 5) If any guys with http compression to spill, we shouldn't wait in
	 *    poll but hurry along and service them
	 */

	} lws_end_foreach_dll(d);

	return timeout_ms;
}